

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

bool Catch::anon_unknown_26::almostEqualUlps<double>(double lhs,double rhs,uint64_t maxUlpDiff)

{
  uint uVar1;
  uint64_t uVar2;
  Catch *this;
  uint64_t ulpDist;
  uint64_t maxUlpDiff_local;
  double rhs_local;
  double lhs_local;
  
  this = (Catch *)maxUlpDiff;
  uVar1 = isnan(lhs);
  if (((uVar1 & 1) == 0) && (uVar1 = isnan(rhs), (uVar1 & 1) == 0)) {
    uVar2 = ulpDistance<double>(this,lhs,rhs);
    return uVar2 <= maxUlpDiff;
  }
  return false;
}

Assistant:

bool almostEqualUlps(FP lhs, FP rhs, uint64_t maxUlpDiff) {
        // Comparison with NaN should always be false.
        // This way we can rule it out before getting into the ugly details
        if (Catch::isnan(lhs) || Catch::isnan(rhs)) {
            return false;
        }

        // This should also handle positive and negative zeros, infinities
        const auto ulpDist = ulpDistance(lhs, rhs);

        return ulpDist <= maxUlpDiff;
    }